

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

String * __thiscall
capnp::compiler::CompilerMain::readOneJson
          (String *__return_storage_ptr__,CompilerMain *this,BufferedInputStreamWrapper *input)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  unsigned_long *puVar4;
  uchar *puVar5;
  size_t sVar6;
  Range<unsigned_long> RVar7;
  Array<char> local_f8;
  char local_d9;
  ArrayPtr<const_unsigned_char> local_d8;
  uchar local_c1;
  size_t sStack_c0;
  char c;
  unsigned_long i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  Array<char> local_88;
  char local_6d [13];
  undefined1 local_60 [8];
  ArrayPtr<const_unsigned_char> buffer;
  Vector<char> chars;
  int local_28;
  undefined4 uStack_24;
  bool sawClose;
  uint depth;
  anon_enum_32 state;
  BufferedInputStreamWrapper *input_local;
  CompilerMain *this_local;
  
  uStack_24 = 0;
  local_28 = 0;
  bVar1 = false;
  kj::Vector<char>::Vector((Vector<char> *)&buffer.size_);
  do {
    iVar3 = (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[4])();
    local_60 = (undefined1  [8])CONCAT44(extraout_var,iVar3);
    bVar2 = kj::ArrayPtr<const_unsigned_char>::operator==
                      ((ArrayPtr<const_unsigned_char> *)local_60,(void *)0x0);
    if (bVar2) {
      local_6d[0] = '\0';
      kj::Vector<char>::add<char>((Vector<char> *)&buffer.size_,local_6d);
      kj::Vector<char>::releaseAsArray(&local_88,(Vector<char> *)&buffer.size_);
      kj::String::String(__return_storage_ptr__,&local_88);
      kj::Array<char>::~Array(&local_88);
LAB_0014346d:
      kj::Vector<char>::~Vector((Vector<char> *)&buffer.size_);
      return __return_storage_ptr__;
    }
    RVar7 = kj::indices<kj::ArrayPtr<unsigned_char_const>&>
                      ((ArrayPtr<const_unsigned_char> *)local_60);
    __begin3.value = RVar7.begin_;
    __end3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
    i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
    while (bVar2 = kj::Range<unsigned_long>::Iterator::operator==(&__end3,(Iterator *)&i),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      puVar4 = kj::Range<unsigned_long>::Iterator::operator*(&__end3);
      sStack_c0 = *puVar4;
      puVar5 = kj::ArrayPtr<const_unsigned_char>::operator[]
                         ((ArrayPtr<const_unsigned_char> *)local_60,sStack_c0);
      local_c1 = *puVar5;
      switch(uStack_24) {
      case 0:
switchD_001431fe_caseD_0:
        if (local_c1 == '#') {
          uStack_24 = 2;
        }
        else if (local_c1 == '/') {
          uStack_24 = 1;
        }
        else if (local_c1 == '{') {
          if ((local_28 == 0) && (bVar1)) {
            local_d8 = kj::ArrayPtr<const_unsigned_char>::first
                                 ((ArrayPtr<const_unsigned_char> *)local_60,sStack_c0);
            kj::Vector<char>::addAll<kj::ArrayPtr<unsigned_char_const>>
                      ((Vector<char> *)&buffer.size_,&local_d8);
            local_d9 = '\0';
            kj::Vector<char>::add<char>((Vector<char> *)&buffer.size_,&local_d9);
            (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])
                      (input,sStack_c0);
            kj::Vector<char>::releaseAsArray(&local_f8,(Vector<char> *)&buffer.size_);
            kj::String::String(__return_storage_ptr__,&local_f8);
            kj::Array<char>::~Array(&local_f8);
            goto LAB_0014346d;
          }
          local_28 = local_28 + 1;
        }
        else if (((local_c1 == '}') && (local_28 != 0)) && (local_28 = local_28 + -1, local_28 == 0)
                ) {
          bVar1 = true;
        }
        break;
      case 1:
        if (local_c1 != '/') goto switchD_001431fe_caseD_0;
        uStack_24 = 2;
        break;
      case 2:
        if (local_c1 == '\n') {
          uStack_24 = 0;
        }
        break;
      case 3:
        if (local_c1 == '\'') {
          uStack_24 = 0;
        }
        else if (local_c1 == '\\') {
          uStack_24 = 4;
        }
        break;
      case 4:
        break;
      case 5:
        if (local_c1 == '\"') {
          uStack_24 = 0;
        }
        else if (local_c1 == '\\') {
          uStack_24 = 6;
        }
        break;
      case 6:
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end3);
    }
    kj::Vector<char>::addAll<kj::ArrayPtr<unsigned_char_const>&>
              ((Vector<char> *)&buffer.size_,(ArrayPtr<const_unsigned_char> *)local_60);
    sVar6 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)local_60);
    (*(input->super_BufferedInputStream).super_InputStream._vptr_InputStream[3])(input,sVar6);
  } while( true );
}

Assistant:

kj::String readOneJson(kj::BufferedInputStreamWrapper& input) {
    // Consume and return one brace-delimited message from the input.
    //
    // Accounts for nested braces, string literals, and comments starting with # or //. Technically
    // JSON does not permit comments but this code is lenient in case we change things later.

    enum {
      NORMAL,
      SLASH,
      COMMENT,
      QUOTE,
      QUOTE_ESCAPE,
      DQUOTE,
      DQUOTE_ESCAPE
    } state = NORMAL;
    uint depth = 0;
    bool sawClose = false;

    kj::Vector<char> chars;

    for (;;) {
      auto buffer = input.tryGetReadBuffer();

      if (buffer == nullptr) {
        // EOF
        chars.add('\0');
        return kj::String(chars.releaseAsArray());
      }

      for (auto i: kj::indices(buffer)) {
        char c = buffer[i];
        switch (state) {
          case SLASH:
            if (c == '/') {
              state = COMMENT;
              break;
            }
            KJ_FALLTHROUGH;
          case NORMAL:
            switch (c) {
              case '#': state = COMMENT; break;
              case '/': state = SLASH; break;
              case '{':
                if (depth == 0 && sawClose) {
                  // We already got one complete message. This is the start of the next message.
                  // Stop here.
                  chars.addAll(buffer.first(i));
                  chars.add('\0');
                  input.skip(i);
                  return kj::String(chars.releaseAsArray());
                }
                ++depth;
                break;
              case '}':
                if (depth > 0) {
                  if (--depth == 0) {
                    sawClose = true;
                  }
                }
                break;
              default: break;
            }
            break;
          case COMMENT:
            switch (c) {
              case '\n': state = NORMAL; break;
              default: break;
            }
            break;
          case QUOTE:
            switch (c) {
              case '\'': state = NORMAL; break;
              case '\\': state = QUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case QUOTE_ESCAPE:
            break;
          case DQUOTE:
            switch (c) {
              case '\"': state = NORMAL; break;
              case '\\': state = DQUOTE_ESCAPE; break;
              default: break;
            }
            break;
          case DQUOTE_ESCAPE:
            break;
        }
      }

      chars.addAll(buffer);
      input.skip(buffer.size());
    }
  }